

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O3

void __thiscall
dgRedBackNode::RemoveFixup(dgRedBackNode *this,dgRedBackNode *thisNode,dgRedBackNode **head)

{
  dgRedBackNode *me;
  byte bVar1;
  dgRedBackNode *me_1;
  dgRedBackNode *pdVar2;
  dgRedBackNode *pdVar3;
  dgRedBackNode *node;
  dgRedBackNode **ppdVar4;
  dgRedBackNode *pdVar5;
  dgRedBackNode **ppdVar6;
  dgRedBackNode *ptr;
  
  pdVar3 = thisNode;
  pdVar2 = this;
  if (*head == thisNode) {
LAB_00854854:
    if (thisNode == (dgRedBackNode *)0x0) {
      return;
    }
  }
  else {
    do {
      thisNode = pdVar2;
      if ((pdVar3 != (dgRedBackNode *)0x0) && (bVar1 = pdVar3->field_0x20, (bVar1 & 1) != 0))
      goto LAB_00854862;
      pdVar2 = thisNode->m_left;
      ppdVar6 = head;
      if (pdVar3 == pdVar2) {
        pdVar2 = thisNode->m_right;
        if (pdVar2 == (dgRedBackNode *)0x0) {
          return;
        }
        if ((pdVar2->field_0x20 & 1) != 0) {
          pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
          thisNode->field_0x20 = thisNode->field_0x20 | 1;
          pdVar3 = thisNode->m_right;
          pdVar2 = pdVar3->m_left;
          thisNode->m_right = pdVar2;
          if (pdVar2 != (dgRedBackNode *)0x0) {
            pdVar2->m_parent = thisNode;
          }
          pdVar2 = thisNode->m_parent;
          pdVar3->m_parent = pdVar2;
          ppdVar4 = head;
          if (pdVar2 != (dgRedBackNode *)0x0) {
            ppdVar4 = &pdVar2->m_right;
            if (pdVar2->m_left == thisNode) {
              ppdVar4 = &pdVar2->m_left;
            }
          }
          *ppdVar4 = pdVar3;
          pdVar3->m_left = thisNode;
          thisNode->m_parent = pdVar3;
          pdVar2 = thisNode->m_right;
          if (pdVar2 == (dgRedBackNode *)0x0) {
            return;
          }
        }
        pdVar3 = pdVar2->m_left;
        if ((pdVar3 == (dgRedBackNode *)0x0) || ((pdVar3->field_0x20 & 1) == 0)) {
          pdVar5 = pdVar2->m_right;
          if ((pdVar5 == (dgRedBackNode *)0x0) || ((pdVar5->field_0x20 & 1) == 0))
          goto LAB_0085469f;
LAB_0085478b:
          if ((pdVar5->field_0x20 & 1) == 0) goto LAB_00854791;
        }
        else {
          pdVar5 = pdVar2->m_right;
          if (pdVar5 != (dgRedBackNode *)0x0) goto LAB_0085478b;
LAB_00854791:
          pdVar3->field_0x20 = pdVar3->field_0x20 & 0xfe;
          pdVar2->field_0x20 = pdVar2->field_0x20 | 1;
          pdVar3 = pdVar2->m_left;
          pdVar5 = pdVar3->m_right;
          pdVar2->m_left = pdVar5;
          if (pdVar5 != (dgRedBackNode *)0x0) {
            pdVar5->m_parent = pdVar2;
          }
          pdVar5 = pdVar2->m_parent;
          pdVar3->m_parent = pdVar5;
          ppdVar4 = head;
          if (pdVar5 != (dgRedBackNode *)0x0) {
            ppdVar4 = &pdVar5->m_left;
            if (pdVar5->m_right == pdVar2) {
              ppdVar4 = &pdVar5->m_right;
            }
          }
          *ppdVar4 = pdVar3;
          pdVar3->m_right = pdVar2;
          pdVar2->m_parent = pdVar3;
          pdVar2 = thisNode->m_right;
          if (pdVar2 == (dgRedBackNode *)0x0) {
            return;
          }
          pdVar5 = pdVar2->m_right;
        }
        pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe | thisNode->field_0x20 & 1;
        if (pdVar5 != (dgRedBackNode *)0x0) {
          pdVar5->field_0x20 = pdVar5->field_0x20 & 0xfe;
        }
        thisNode->field_0x20 = thisNode->field_0x20 & 0xfe;
        pdVar3 = thisNode->m_right;
        pdVar2 = pdVar3->m_left;
        thisNode->m_right = pdVar2;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          pdVar2->m_parent = thisNode;
        }
        pdVar2 = thisNode->m_parent;
        pdVar3->m_parent = pdVar2;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          ppdVar6 = &pdVar2->m_right;
          if (pdVar2->m_left == thisNode) {
            ppdVar6 = &pdVar2->m_left;
          }
        }
        ppdVar4 = &pdVar3->m_left;
LAB_00854847:
        *ppdVar6 = pdVar3;
        *ppdVar4 = thisNode;
        thisNode->m_parent = pdVar3;
        thisNode = *head;
        goto LAB_00854854;
      }
      if (pdVar2 == (dgRedBackNode *)0x0) {
        return;
      }
      if ((pdVar2->field_0x20 & 1) != 0) {
        pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
        thisNode->field_0x20 = thisNode->field_0x20 | 1;
        pdVar3 = thisNode->m_left;
        pdVar2 = pdVar3->m_right;
        thisNode->m_left = pdVar2;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          pdVar2->m_parent = thisNode;
        }
        pdVar2 = thisNode->m_parent;
        pdVar3->m_parent = pdVar2;
        ppdVar4 = head;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          ppdVar4 = &pdVar2->m_left;
          if (pdVar2->m_right == thisNode) {
            ppdVar4 = &pdVar2->m_right;
          }
        }
        *ppdVar4 = pdVar3;
        pdVar3->m_right = thisNode;
        thisNode->m_parent = pdVar3;
        pdVar2 = thisNode->m_left;
        if (pdVar2 == (dgRedBackNode *)0x0) {
          return;
        }
      }
      pdVar3 = pdVar2->m_right;
      if ((pdVar3 != (dgRedBackNode *)0x0) && ((pdVar3->field_0x20 & 1) != 0)) {
        pdVar5 = pdVar2->m_left;
        if (pdVar5 != (dgRedBackNode *)0x0) goto LAB_008546c1;
LAB_008546c7:
        pdVar3->field_0x20 = pdVar3->field_0x20 & 0xfe;
        pdVar2->field_0x20 = pdVar2->field_0x20 | 1;
        pdVar3 = pdVar2->m_right;
        pdVar5 = pdVar3->m_left;
        pdVar2->m_right = pdVar5;
        if (pdVar5 != (dgRedBackNode *)0x0) {
          pdVar5->m_parent = pdVar2;
        }
        pdVar5 = pdVar2->m_parent;
        pdVar3->m_parent = pdVar5;
        ppdVar4 = head;
        if (pdVar5 != (dgRedBackNode *)0x0) {
          ppdVar4 = &pdVar5->m_right;
          if (pdVar5->m_left == pdVar2) {
            ppdVar4 = &pdVar5->m_left;
          }
        }
        *ppdVar4 = pdVar3;
        pdVar3->m_left = pdVar2;
        pdVar2->m_parent = pdVar3;
        pdVar2 = thisNode->m_left;
        if (pdVar2 == (dgRedBackNode *)0x0) {
          return;
        }
        pdVar5 = pdVar2->m_left;
LAB_00854720:
        pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe | thisNode->field_0x20 & 1;
        if (pdVar5 != (dgRedBackNode *)0x0) {
          pdVar5->field_0x20 = pdVar5->field_0x20 & 0xfe;
        }
        thisNode->field_0x20 = thisNode->field_0x20 & 0xfe;
        pdVar3 = thisNode->m_left;
        pdVar2 = pdVar3->m_right;
        thisNode->m_left = pdVar2;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          pdVar2->m_parent = thisNode;
        }
        pdVar2 = thisNode->m_parent;
        pdVar3->m_parent = pdVar2;
        if (pdVar2 != (dgRedBackNode *)0x0) {
          ppdVar6 = &pdVar2->m_left;
          if (pdVar2->m_right == thisNode) {
            ppdVar6 = &pdVar2->m_right;
          }
        }
        ppdVar4 = &pdVar3->m_right;
        goto LAB_00854847;
      }
      pdVar5 = pdVar2->m_left;
      if ((pdVar5 != (dgRedBackNode *)0x0) && ((pdVar5->field_0x20 & 1) != 0)) {
LAB_008546c1:
        if ((pdVar5->field_0x20 & 1) == 0) goto LAB_008546c7;
        goto LAB_00854720;
      }
LAB_0085469f:
      pdVar2->field_0x20 = pdVar2->field_0x20 | 1;
      pdVar3 = thisNode;
      pdVar2 = thisNode->m_parent;
    } while (thisNode != *head);
  }
  bVar1 = thisNode->field_0x20;
  pdVar3 = thisNode;
LAB_00854862:
  pdVar3->field_0x20 = bVar1 & 0xfe;
  return;
}

Assistant:

void dgRedBackNode::RemoveFixup (dgRedBackNode* const thisNode, dgRedBackNode ** const head) 
{
	dgRedBackNode* ptr = this;
	dgRedBackNode* node = thisNode;
	while ((node != *head) && (!node || node->GetColor() == BLACK)) {
		if (node == ptr->m_left) {
			if (!ptr) {
				return;
			}
			dgRedBackNode* tmp = ptr->m_right;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateLeft (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			if ((!tmp->m_left  || (tmp->m_left->GetColor() == BLACK)) && 
				 (!tmp->m_right || (tmp->m_right->GetColor() == BLACK))) {
				tmp->SetColor(RED);
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) {
				tmp->m_left->SetColor(BLACK);
				tmp->SetColor(RED);
				tmp->RotateRight (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_right) {
				tmp->m_right->SetColor(BLACK) ;
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateLeft (head);
			}
			node = *head;

		} else {
		  	if (!ptr) {
				return;
		  	}
			dgRedBackNode* tmp = ptr->m_left;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateRight (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}

			if ((!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) && 
				 (!tmp->m_left  || (tmp->m_left->GetColor() == BLACK))) {
				tmp->SetColor(RED) ;
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_left || (tmp->m_left->GetColor() == BLACK)) {
				tmp->m_right->SetColor(BLACK) ;
				tmp->SetColor(RED) ;
				tmp->RotateLeft (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_left) {
				tmp->m_left->SetColor(BLACK);
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateRight (head);
			}
			node = *head;
		}
	}
	if (node) {
		node->SetColor(BLACK);
	}
}